

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O2

K __thiscall
snmalloc::
RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
::remove_min(RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
             *this)

{
  bool bVar1;
  K KVar2;
  undefined8 auStack_838 [2];
  RBPath path;
  
  if (this->root < 0x200) {
    KVar2 = 0;
  }
  else {
    auStack_838[1] = 0x104726;
    RBPath::RBPath(&path,(Handle)this);
    do {
      auStack_838[1] = 0x104733;
      bVar1 = RBPath::move(&path,true);
    } while (bVar1);
    KVar2 = *(ulong *)auStack_838[path.length * 2] & 0xfffffffffffffe00;
    auStack_838[1] = 0x10475d;
    remove_path(this,&path);
  }
  return KVar2;
}

Assistant:

bool is_null()
      {
        return Rep::get(ptr) == Rep::null;
      }